

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O1

void __thiscall StochasticProcess::~StochasticProcess(StochasticProcess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015cbf0;
  (this->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__StochasticProcess_0015cc78;
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__StochasticProcess_0015ccc0;
  pcVar2 = (this->stochDescription)._M_dataplus._M_p;
  paVar1 = &(this->stochDescription).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Physical::~Physical(&this->super_Physical);
  TimeDependent::~TimeDependent(&this->super_TimeDependent);
  Parametric::~Parametric(&this->super_Parametric);
  return;
}

Assistant:

virtual ~StochasticProcess() {}